

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int sam_parse1(kstring_t *s,bam_hdr_t *h,bam1_t *b)

{
  undefined1 *puVar1;
  double *pdVar2;
  double dVar3;
  bam1_t *pbVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  int8_t *piVar9;
  long lVar10;
  uint8_t *puVar11;
  ushort **ppuVar12;
  ulong uVar13;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  double *pdVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  size_t __n;
  byte *__n_00;
  kstring_t *pkVar18;
  char *pcVar19;
  long lVar20;
  short sVar21;
  double *__nptr;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  byte *pbVar25;
  ulong uVar26;
  uint8_t *puVar27;
  double *pdVar28;
  int iVar29;
  bool bVar30;
  float x_1;
  int16_t y;
  kstring_t str;
  double *local_80;
  kstring_t *local_78;
  double *local_70;
  bam1_t *local_68;
  float local_5c;
  double local_58;
  kstring_t local_50;
  double *local_38;
  
  pdVar28 = (double *)s->s;
  b->l_data = 0;
  local_50.l = 0;
  puVar27 = b->data;
  uVar24 = (ulong)b->m_data;
  (b->core).l_qseq = 0;
  (b->core).mtid = 0;
  (b->core).mpos = 0;
  (b->core).isize = 0;
  (b->core).tid = 0;
  (b->core).pos = 0;
  *(undefined8 *)&(b->core).field_0x8 = 0;
  local_70 = pdVar28;
  local_50.m = uVar24;
  local_50.s = (char *)puVar27;
  if (h->cigar_tab == (int8_t *)0x0) {
    piVar9 = (int8_t *)malloc(0x80);
    h->cigar_tab = piVar9;
    lVar10 = 0;
    do {
      h->cigar_tab[lVar10] = -1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x80);
    lVar10 = 0;
    do {
      h->cigar_tab["MIDNSHP=XB"[lVar10]] = (int8_t)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
  }
  pcVar19 = (char *)((long)local_70 + (1 - (long)pdVar28));
  lVar10 = (long)pcVar19 << 0x20;
  lVar20 = (long)pcVar19 * 0x1000000;
  for (; *(char *)local_70 != '\0'; local_70 = (double *)((long)local_70 + 1)) {
    if (*(char *)local_70 == '\t') {
      pdVar14 = (double *)((long)local_70 + 1);
      *(char *)local_70 = '\0';
      uVar17 = lVar10 >> 0x20;
      local_80 = pdVar28;
      local_78 = s;
      local_70 = pdVar14;
      local_68 = b;
      puVar11 = (uint8_t *)local_50.s;
      if (uVar24 < uVar17) {
        uVar24 = uVar17 + -1 >> 1 | uVar17 + -1;
        uVar24 = uVar24 >> 2 | uVar24;
        uVar24 = uVar24 >> 4 | uVar24;
        uVar24 = uVar24 >> 8 | uVar24;
        local_50.m = (uVar24 >> 0x10 | uVar24) + 1;
        puVar11 = (uint8_t *)realloc(puVar27,local_50.m);
        if (puVar11 != (uint8_t *)0x0) goto LAB_0013d395;
      }
      else {
LAB_0013d395:
        local_50.s = (char *)puVar11;
        memcpy(local_50.s,pdVar28,uVar17);
        local_50.l = uVar17;
      }
      b = local_68;
      (local_68->core).field_0xb = (char)((ulong)lVar20 >> 0x18);
      lVar10 = strtol((char *)pdVar14,(char **)&local_70,0);
      *(short *)&(b->core).field_0xc = (short)lVar10;
      pdVar28 = (double *)((long)local_70 + 1);
      pdVar14 = pdVar28;
      if (*(char *)local_70 == '\t') goto LAB_0013d3ee;
      break;
    }
    lVar10 = lVar10 + 0x100000000;
    lVar20 = lVar20 + 0x1000000;
  }
LAB_0013d7af:
  iVar7 = -2;
LAB_0013d7b4:
  b->data = (uint8_t *)local_50.s;
  b->l_data = (int)local_50.l;
  b->m_data = (int)local_50.m;
  return iVar7;
LAB_0013d3ee:
  if (*(char *)pdVar14 != '\0') {
    if (*(char *)pdVar14 != '\t') goto code_r0x0013d3fe;
    *(char *)pdVar14 = '\0';
    local_80 = pdVar28;
    local_70 = (double *)((long)pdVar14 + 1);
    iVar7 = strcmp((char *)pdVar28,"*");
    if (iVar7 == 0) {
      (b->core).tid = -1;
    }
    else {
      if ((h->n_targets == 0) && (0 < hts_verbose)) {
        sam_parse1_cold_2();
        goto LAB_0013d7af;
      }
      iVar7 = bam_name2id(h,(char *)pdVar28);
      (b->core).tid = iVar7;
      if ((iVar7 < 0) && (1 < hts_verbose)) {
        sam_parse1_cold_1();
      }
    }
    lVar10 = strtol((char *)((long)pdVar14 + 1),(char **)&local_70,10);
    iVar7 = (int)lVar10 + -1;
    (b->core).pos = iVar7;
    pdVar28 = (double *)((long)local_70 + 1);
    if (*(char *)local_70 == '\t') {
      local_70 = pdVar28;
      if ((iVar7 < 0) && (-1 < (b->core).tid)) {
        if (1 < hts_verbose) {
          sam_parse1_cold_3();
        }
        (b->core).tid = -1;
      }
      if ((b->core).tid < 0) {
        puVar1 = &(b->core).field_0xc;
        *puVar1 = *puVar1 | 4;
      }
      lVar10 = strtol((char *)pdVar28,(char **)&local_70,10);
      uVar24 = *(ulong *)&(b->core).field_0x8;
      uVar17 = (ulong)(((uint)lVar10 & 0xff) << 0x10);
      *(ulong *)&(b->core).field_0x8 = uVar24 & 0xffffffffff00ffff | uVar17;
      pdVar28 = (double *)((long)local_70 + 1);
      if (*(char *)local_70 == '\t') {
        local_70 = pdVar28;
        if (*(byte *)pdVar28 != 0x2a) {
          uVar23 = 0;
          local_80 = pdVar28;
          while( true ) {
            pdVar14 = (double *)((long)pdVar28 + 1);
            bVar6 = *(byte *)pdVar28;
            uVar13 = (ulong)bVar6;
            if ((bVar6 == 0) || (bVar6 == 9)) break;
            ppuVar12 = __ctype_b_loc();
            uVar23 = uVar23 + ((*(byte *)((long)*ppuVar12 + (long)(char)bVar6 * 2 + 1) & 8) == 0);
            pdVar28 = pdVar14;
          }
          uVar26 = 10;
          iVar7 = 0xb;
          local_70 = pdVar14;
          if (bVar6 == 9) {
            if ((uVar23 < 0x10000) || (hts_verbose < 1)) {
              *(ulong *)&(b->core).field_0x8 = uVar24 & 0xffffff00ffff | uVar17 | uVar23 << 0x30;
              ks_resize(&local_50,local_50.l + (((uint)uVar23 & 0xffff) << 2));
              pcVar19 = local_50.s;
              sVar5 = local_50.l;
              uVar13 = *(ulong *)&(b->core).field_0x8 >> 0x30;
              local_50.l = local_50.l + uVar13 * 4;
              bVar30 = true;
              if (uVar13 != 0) {
                uVar26 = 0;
                do {
                  lVar10 = strtol((char *)local_80,(char **)&local_80,10);
                  uVar22 = (int)lVar10 << 4;
                  *(uint *)(pcVar19 + sVar5 + uVar26 * 4) = uVar22;
                  if ((long)(char)*(byte *)local_80 < 0) {
                    uVar15 = 0xffffffff;
                  }
                  else {
                    uVar15 = (uint)h->cigar_tab[(char)*(byte *)local_80];
                  }
                  if (0 < hts_verbose && (int)uVar15 < 0) {
                    sam_parse1_cold_4();
                    iVar7 = 0xb;
                    uVar13 = extraout_RAX;
                    b = local_68;
                    goto LAB_0013d718;
                  }
                  *(uint *)(pcVar19 + sVar5 + uVar26 * 4) = uVar15 | uVar22;
                  uVar26 = uVar26 + 1;
                  local_80 = (double *)((long)local_80 + 1);
                  uVar24 = *(ulong *)&(local_68->core).field_0x8;
                  uVar13 = uVar24 >> 0x30;
                } while (uVar26 < uVar13);
                bVar30 = uVar24 < 0x1000000000000;
                b = local_68;
              }
              iVar7 = 0;
              uVar26 = 0;
              if (!bVar30) {
                iVar7 = 0;
                uVar24 = 0;
                uVar26 = 0;
                do {
                  uVar26 = (ulong)((int)uVar26 +
                                  (*(uint *)(pcVar19 + sVar5 + uVar24 * 4) >> 4 &
                                  (int)((0x3c1a7U >>
                                        ((char)*(uint *)(pcVar19 + sVar5 + uVar24 * 4) * '\x02' &
                                        0x1fU)) << 0x1e) >> 0x1f));
                  uVar24 = uVar24 + 1;
                } while (uVar13 != uVar24);
              }
            }
            else {
              sam_parse1_cold_5();
              uVar13 = extraout_RAX_00;
            }
          }
LAB_0013d718:
          iVar8 = (int)uVar13;
          iVar29 = (int)uVar26;
          if (iVar7 == 0) goto LAB_0013d72a;
          goto joined_r0x0013d71f;
        }
        if (((uVar24 >> 0x22 & 1) == 0) && (1 < hts_verbose)) {
          sam_parse1_cold_6();
        }
        puVar1 = &(b->core).field_0x8;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000;
        goto LAB_0013d53f;
      }
    }
  }
  goto LAB_0013d7af;
code_r0x0013d3fe:
  pdVar14 = (double *)((long)pdVar14 + 1);
  goto LAB_0013d3ee;
LAB_0013d53f:
  if (*(byte *)local_70 == 0) goto LAB_0013d7af;
  if (*(byte *)local_70 != 9) goto code_r0x0013d553;
  *(byte *)local_70 = 0;
  iVar29 = 1;
  local_70 = (double *)((long)local_70 + 1);
LAB_0013d72a:
  pdVar28 = local_70;
  lVar10 = (long)(b->core).pos;
  iVar7 = 0x1249;
  bVar6 = 0xe;
  uVar22 = 6;
  bVar16 = 0xc;
  sVar21 = 0;
  do {
    lVar20 = lVar10 >> (bVar6 & 0x3f);
    if (lVar20 == lVar10 + iVar29 + -1 >> (bVar6 & 0x3f)) {
      sVar21 = (short)iVar7 + (short)lVar20;
      break;
    }
    bVar6 = bVar6 + 3;
    iVar7 = iVar7 + (-1 << (bVar16 & 0x1f));
    uVar22 = uVar22 - 1;
    bVar16 = bVar16 - 3;
  } while (1 < uVar22);
  *(short *)&(b->core).field_0x8 = sVar21;
  local_80 = local_70;
  while( true ) {
    if (*(byte *)local_70 == 0) goto LAB_0013d7af;
    if (*(byte *)local_70 == 9) break;
    local_70 = (double *)((long)local_70 + 1);
  }
  pdVar14 = (double *)((long)local_70 + 1);
  *(byte *)local_70 = 0;
  local_70 = pdVar14;
  iVar7 = strcmp((char *)pdVar28,"=");
  if (iVar7 == 0) {
    iVar7 = (b->core).tid;
  }
  else {
    iVar7 = strcmp((char *)pdVar28,"*");
    if (iVar7 == 0) {
      iVar7 = -1;
    }
    else {
      iVar7 = bam_name2id(h,(char *)pdVar28);
    }
  }
  (b->core).mtid = iVar7;
  lVar10 = strtol((char *)pdVar14,(char **)&local_70,10);
  iVar7 = (int)lVar10 + -1;
  (b->core).mpos = iVar7;
  pdVar28 = (double *)((long)local_70 + 1);
  if (*(byte *)local_70 != 9) goto LAB_0013d7af;
  local_70 = pdVar28;
  if ((iVar7 < 0) && (-1 < (b->core).mtid)) {
    if (1 < hts_verbose) {
      sam_parse1_cold_7();
    }
    (b->core).mtid = -1;
  }
  lVar10 = strtol((char *)pdVar28,(char **)&local_70,10);
  pdVar14 = local_70;
  (b->core).isize = (int32_t)lVar10;
  pdVar28 = (double *)((long)local_70 + 1);
  if (*(byte *)local_70 != 9) goto LAB_0013d7af;
  lVar10 = 0;
  while( true ) {
    b = local_68;
    if (*(byte *)((long)pdVar28 + lVar10) == 0) goto LAB_0013d7af;
    if (*(byte *)((long)pdVar28 + lVar10) == 9) break;
    lVar10 = lVar10 + 1;
  }
  local_70 = (double *)((byte *)((long)pdVar28 + lVar10) + 1);
  *(byte *)((long)pdVar28 + lVar10) = 0;
  local_80 = pdVar28;
  local_38 = local_70;
  iVar7 = strcmp((char *)pdVar28,"*");
  if (iVar7 == 0) {
    (local_68->core).l_qseq = 0;
  }
  else {
    uVar22 = (uint)pdVar14;
    iVar8 = (int)lVar10;
    iVar29 = (int)pdVar28;
    (local_68->core).l_qseq = ~uVar22 + iVar8 + iVar29;
    uVar24 = *(ulong *)&(local_68->core).field_0x8;
    iVar7 = 0;
    if (uVar24 >> 0x30 != 0) {
      uVar17 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (*(uint *)(local_50.s + uVar17 * 4 + (uVar24 >> 0x18 & 0xff)) >> 4 &
                        -(uint)((0x3c1a7U >>
                                 (*(uint *)(local_50.s + uVar17 * 4 + (uVar24 >> 0x18 & 0xff)) * 2 &
                                 0x1f) & 1) != 0));
        uVar17 = uVar17 + 1;
      } while (uVar24 >> 0x30 != uVar17);
    }
    if (((0xffffffffffff < uVar24) && (((iVar29 - uVar22) - iVar7) + iVar8 != 1)) &&
       (0 < hts_verbose)) {
      sam_parse1_cold_8();
      b = local_68;
      goto LAB_0013d7af;
    }
    __n = (size_t)((int)((iVar29 - uVar22) + iVar8) >> 1);
    ks_resize(&local_50,local_50.l + __n);
    puVar27 = (uint8_t *)(local_50.s + local_50.l);
    local_50.l = local_50.l + __n;
    memset(puVar27,0,__n);
    if (0 < (local_68->core).l_qseq) {
      bVar6 = 0;
      uVar24 = 0;
      do {
        puVar27[uVar24 >> 1 & 0x7fffffff] =
             puVar27[uVar24 >> 1 & 0x7fffffff] |
             "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x01\x02\x04\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
             [(char)*(byte *)((long)pdVar28 + uVar24)] << (~bVar6 & 4);
        uVar24 = uVar24 + 1;
        bVar6 = bVar6 + 4;
      } while ((long)uVar24 < (long)(local_68->core).l_qseq);
    }
  }
  pbVar4 = local_68;
  local_80 = local_38;
  pbVar25 = (byte *)((long)local_70 + (~(ulong)pdVar28 - lVar10));
  pdVar14 = local_70;
  while( true ) {
    local_70 = (double *)((long)pdVar14 + 1);
    if ((*(byte *)pdVar14 == 0) || (*(byte *)pdVar14 == 9)) break;
    pbVar25 = pbVar25 + 1;
    pdVar14 = local_70;
  }
  *(byte *)pdVar14 = 0;
  ks_resize(&local_50,local_50.l + (long)(local_68->core).l_qseq);
  puVar27 = (uint8_t *)(local_50.s + local_50.l);
  __n_00 = (byte *)(long)(pbVar4->core).l_qseq;
  local_50.l = local_50.l + (long)__n_00;
  iVar7 = strcmp((char *)local_38,"*");
  if (iVar7 == 0) {
    memset(puVar27,0xff,(size_t)__n_00);
    pkVar18 = local_78;
    b = local_68;
    pdVar14 = local_70;
  }
  else {
    if ((__n_00 != pbVar25) && (0 < hts_verbose)) {
      sam_parse1_cold_9();
      b = local_68;
      goto LAB_0013d7af;
    }
    pkVar18 = local_78;
    b = local_68;
    pdVar14 = local_70;
    if (0 < (local_68->core).l_qseq) {
      lVar20 = 0;
      do {
        puVar27[lVar20] = *(byte *)((long)pdVar28 + lVar10 + 1 + lVar20) - 0x21;
        lVar20 = lVar20 + 1;
      } while (lVar20 < (local_68->core).l_qseq);
    }
  }
LAB_0013db1d:
  if (pkVar18->s + pkVar18->l <= pdVar14) {
    iVar7 = 0;
    goto LAB_0013d7b4;
  }
  lVar10 = 4;
  for (pdVar28 = pdVar14; (*(byte *)pdVar28 != 0 && (*(byte *)pdVar28 != 9));
      pdVar28 = (double *)((long)pdVar28 + 1)) {
    lVar10 = lVar10 + -1;
  }
  pdVar2 = (double *)((long)pdVar28 + 1);
  *(byte *)pdVar28 = 0;
  local_80 = pdVar14;
  local_70 = pdVar2;
  if ((lVar10 + -5 < -6) || (hts_verbose < 1)) {
    kputsn_(pdVar14,2,&local_50);
    b = local_68;
    pkVar18 = local_78;
    bVar6 = *(byte *)((long)pdVar14 + 3);
    __nptr = (double *)((long)pdVar14 + 5);
    local_80 = __nptr;
    if ((0x22 < bVar6 - 0x41) || ((0x500000005U >> ((ulong)(bVar6 - 0x41) & 0x3f) & 1) == 0)) {
      if ((bVar6 & 0xdf) == 0x49) {
        if (*(byte *)__nptr == 0x2d) {
          uVar24 = strtol((char *)__nptr,(char **)&local_80,10);
          if ((long)uVar24 < -0x80) {
            if (-0x8001 < (long)uVar24) {
              local_58 = (double)CONCAT62(local_58._2_6_,(short)uVar24);
              iVar7 = 0x73;
              goto LAB_0013dd4c;
            }
            local_58 = (double)CONCAT44(local_58._4_4_,(int)uVar24);
            iVar7 = 0x69;
LAB_0013ded3:
            b = local_68;
            kputc_(iVar7,&local_50);
            iVar7 = 4;
LAB_0013dee5:
            iVar8 = kputsn_(&local_58,iVar7,&local_50);
            pkVar18 = local_78;
            goto LAB_0013dbe1;
          }
          iVar7 = 99;
        }
        else {
          uVar24 = strtoul((char *)__nptr,(char **)&local_80,10);
          if (0xff < uVar24) {
            if (0xffff < uVar24) {
              local_58 = (double)CONCAT44(local_58._4_4_,(int)uVar24);
              iVar7 = 0x49;
              goto LAB_0013ded3;
            }
            local_58 = (double)CONCAT62(local_58._2_6_,(short)uVar24);
            iVar7 = 0x53;
LAB_0013dd4c:
            b = local_68;
            kputc_(iVar7,&local_50);
            iVar7 = 2;
            goto LAB_0013dee5;
          }
          iVar7 = 0x43;
        }
        b = local_68;
        kputc_(iVar7,&local_50);
        iVar8 = kputc_((int)uVar24,&local_50);
        pkVar18 = local_78;
        goto LAB_0013dbe1;
      }
      if (0x59 < bVar6) {
        if (bVar6 == 0x5a) goto LAB_0013dd04;
        if (bVar6 == 100) {
          local_58 = strtod((char *)__nptr,(char **)&local_80);
          kputc_(100,&local_50);
          __nptr = &local_58;
          iVar7 = 8;
        }
        else {
          if (bVar6 != 0x66) goto LAB_0013ddee;
          dVar3 = strtod((char *)__nptr,(char **)&local_80);
          local_58 = (double)CONCAT44(local_58._4_4_,(float)dVar3);
          kputc_(0x66,&local_50);
          __nptr = &local_58;
          iVar7 = 4;
        }
LAB_0013dd92:
        iVar8 = kputsn_(__nptr,iVar7,&local_50);
        b = local_68;
        goto LAB_0013dbe1;
      }
      if (bVar6 != 0x42) {
        if (bVar6 != 0x48) {
LAB_0013ddee:
          iVar8 = 0x16b458;
          if (0 < hts_verbose) {
            sam_parse1_cold_11();
            iVar7 = 0xb;
            iVar8 = extraout_EAX_00;
            goto LAB_0013dbe4;
          }
          goto LAB_0013dbe1;
        }
LAB_0013dd04:
        kputc_((uint)bVar6,&local_50);
        iVar7 = -(int)lVar10;
        goto LAB_0013dd92;
      }
      if ((lVar10 < -3) || (hts_verbose < 1)) {
        local_80 = (double *)((long)pdVar14 + 6);
        bVar6 = *(byte *)((long)pdVar14 + 5);
        iVar7 = 0;
        pdVar14 = local_80;
        do {
          if (*(byte *)pdVar14 == 0x2c) {
            iVar7 = iVar7 + 1;
          }
          else if (*(byte *)pdVar14 == 0) goto LAB_0013de13;
          pdVar14 = (double *)((long)pdVar14 + 1);
        } while( true );
      }
      goto LAB_0013e114;
    }
    kputc_(0x41,&local_50);
    iVar8 = kputc_((int)(char)*(byte *)__nptr,&local_50);
    pkVar18 = local_78;
    b = local_68;
    goto LAB_0013dbe1;
  }
  sam_parse1_cold_12();
  iVar7 = 0xb;
  pkVar18 = local_78;
  b = local_68;
  iVar8 = extraout_EAX;
  goto LAB_0013dbe4;
code_r0x0013d553:
  local_70 = (double *)((long)local_70 + 1);
  goto LAB_0013d53f;
LAB_0013de13:
  local_58 = (double)CONCAT44((int)((ulong)local_58 >> 0x20),iVar7);
  kputc_(0x42,&local_50);
  kputc_((uint)bVar6,&local_50);
  uVar22 = kputsn_(&local_58,4,&local_50);
  uVar24 = (ulong)uVar22;
  if (bVar6 < 99) {
    if (bVar6 == 0x43) {
      while (local_80 < pdVar28) {
        uVar24 = strtoul((char *)((long)local_80 + 1),(char **)&local_80,0);
        uVar22 = kputc_((uint)uVar24 & 0xff,&local_50);
        uVar24 = (ulong)uVar22;
      }
    }
    else if (bVar6 == 0x49) {
      while (local_80 < pdVar28) {
        uVar24 = strtoul((char *)((long)local_80 + 1),(char **)&local_80,0);
        local_5c = (float)uVar24;
        uVar22 = kputsn_(&local_5c,4,&local_50);
        uVar24 = (ulong)uVar22;
      }
    }
    else {
      if (bVar6 != 0x53) goto LAB_0013e003;
      while (local_80 < pdVar28) {
        uVar24 = strtoul((char *)((long)local_80 + 1),(char **)&local_80,0);
        local_5c = (float)CONCAT22(local_5c._2_2_,(short)uVar24);
        uVar22 = kputsn_(&local_5c,2,&local_50);
        uVar24 = (ulong)uVar22;
      }
    }
  }
  else if (bVar6 < 0x69) {
    if (bVar6 == 99) {
      if (local_80 < pdVar28) {
        do {
          lVar10 = strtol((char *)((long)local_80 + 1),(char **)&local_80,0);
          uVar22 = kputc_((int)(char)lVar10,&local_50);
          uVar24 = (ulong)uVar22;
        } while (local_80 < pdVar28);
      }
    }
    else {
      if (bVar6 != 0x66) {
LAB_0013e003:
        if (hts_verbose < 1) {
          iVar7 = 0;
          iVar8 = 0x16b401;
        }
        else {
LAB_0013e114:
          sam_parse1_cold_10();
          iVar7 = 0xb;
          iVar8 = 0;
        }
        goto LAB_0013e102;
      }
      while (local_80 < pdVar28) {
        dVar3 = strtod((char *)((long)local_80 + 1),(char **)&local_80);
        local_5c = (float)dVar3;
        uVar22 = kputsn_(&local_5c,4,&local_50);
        uVar24 = (ulong)uVar22;
      }
    }
  }
  else if (bVar6 == 0x69) {
    while (local_80 < pdVar28) {
      lVar10 = strtol((char *)((long)local_80 + 1),(char **)&local_80,0);
      local_5c = (float)lVar10;
      uVar22 = kputsn_(&local_5c,4,&local_50);
      uVar24 = (ulong)uVar22;
    }
  }
  else {
    if (bVar6 != 0x73) goto LAB_0013e003;
    while (local_80 < pdVar28) {
      lVar10 = strtol((char *)((long)local_80 + 1),(char **)&local_80,0);
      local_5c = (float)CONCAT22(local_5c._2_2_,(short)lVar10);
      uVar22 = kputsn_(&local_5c,2,&local_50);
      uVar24 = (ulong)uVar22;
    }
  }
  iVar7 = 0;
  iVar8 = (int)CONCAT71((int7)(uVar24 >> 8),1);
LAB_0013e102:
  pkVar18 = local_78;
  b = local_68;
  if ((char)iVar8 != '\0') {
LAB_0013dbe1:
    iVar7 = 0;
  }
LAB_0013dbe4:
  pdVar14 = pdVar2;
  if (iVar7 != 0) goto joined_r0x0013d71f;
  goto LAB_0013db1d;
joined_r0x0013d71f:
  if (iVar7 != 0xb) {
    return iVar8;
  }
  goto LAB_0013d7af;
}

Assistant:

int sam_parse1(kstring_t *s, bam_hdr_t *h, bam1_t *b)
{
#define _read_token(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); if (*(_p) != '\t') goto err_ret; *(_p)++ = 0
#define _read_token_aux(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); *(_p)++ = 0 // this is different in that it does not test *(_p)=='\t'
#define _get_mem(type_t, _x, _s, _l) ks_resize((_s), (_s)->l + (_l)); *(_x) = (type_t*)((_s)->s + (_s)->l); (_s)->l += (_l)
#define _parse_err(cond, msg) do { if ((cond) && hts_verbose >= 1) { fprintf(stderr, "[E::%s] " msg "\n", __func__); goto err_ret; } } while (0)
#define _parse_warn(cond, msg) if ((cond) && hts_verbose >= 2) fprintf(stderr, "[W::%s] " msg "\n", __func__)

    uint8_t *t;
    char *p = s->s, *q;
    int i;
    kstring_t str;
    bam1_core_t *c = &b->core;

    str.l = b->l_data = 0;
    str.s = (char*)b->data; str.m = b->m_data;
    memset(c, 0, 32);
    if (h->cigar_tab == 0) {
        h->cigar_tab = (int8_t*) malloc(128);
        for (i = 0; i < 128; ++i)
            h->cigar_tab[i] = -1;
        for (i = 0; BAM_CIGAR_STR[i]; ++i)
            h->cigar_tab[(int)BAM_CIGAR_STR[i]] = i;
    }
    // qname
    q = _read_token(p);
    kputsn_(q, p - q, &str);
    c->l_qname = p - q;
    // flag
    c->flag = strtol(p, &p, 0);
    if (*p++ != '\t') goto err_ret; // malformated flag
    // chr
    q = _read_token(p);
    if (strcmp(q, "*")) {
        _parse_err(h->n_targets == 0, "missing SAM header");
        c->tid = bam_name2id(h, q);
        _parse_warn(c->tid < 0, "urecognized reference name; treated as unmapped");
    } else c->tid = -1;
    // pos
    c->pos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->pos < 0 && c->tid >= 0) {
        _parse_warn(1, "mapped query cannot have zero coordinate; treated as unmapped");
        c->tid = -1;
    }
    if (c->tid < 0) c->flag |= BAM_FUNMAP;
    // mapq
    c->qual = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // cigar
    if (*p != '*') {
        uint32_t *cigar;
        size_t n_cigar = 0;
        for (q = p; *p && *p != '\t'; ++p)
            if (!isdigit(*p)) ++n_cigar;
        if (*p++ != '\t') goto err_ret;
        _parse_err(n_cigar >= 65536, "too many CIGAR operations");
        c->n_cigar = n_cigar;
        _get_mem(uint32_t, &cigar, &str, c->n_cigar<<2);
        for (i = 0; i < c->n_cigar; ++i, ++q) {
            int op;
            cigar[i] = strtol(q, &q, 10)<<BAM_CIGAR_SHIFT;
            op = (uint8_t)*q >= 128? -1 : h->cigar_tab[(int)*q];
            _parse_err(op < 0, "unrecognized CIGAR operator");
            cigar[i] |= op;
        }
        i = bam_cigar2rlen(c->n_cigar, cigar);
    } else {
        _parse_warn(!(c->flag&BAM_FUNMAP), "mapped query must have a CIGAR; treated as unmapped");
        c->flag |= BAM_FUNMAP;
        q = _read_token(p);
        i = 1;
    }
    c->bin = hts_reg2bin(c->pos, c->pos + i, 14, 5);
    // mate chr
    q = _read_token(p);
    if (strcmp(q, "=") == 0) c->mtid = c->tid;
    else if (strcmp(q, "*") == 0) c->mtid = -1;
    else c->mtid = bam_name2id(h, q);
    // mpos
    c->mpos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->mpos < 0 && c->mtid >= 0) {
        _parse_warn(1, "mapped mate cannot have zero coordinate; treated as unmapped");
        c->mtid = -1;
    }
    // tlen
    c->isize = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // seq
    q = _read_token(p);
    if (strcmp(q, "*")) {
        c->l_qseq = p - q - 1;
        i = bam_cigar2qlen(c->n_cigar, (uint32_t*)(str.s + c->l_qname));
        _parse_err(c->n_cigar && i != c->l_qseq, "CIGAR and query sequence are of different length");
        i = (c->l_qseq + 1) >> 1;
        _get_mem(uint8_t, &t, &str, i);
        memset(t, 0, i);
        for (i = 0; i < c->l_qseq; ++i)
            t[i>>1] |= seq_nt16_table[(int)q[i]] << ((~i&1)<<2);
    } else c->l_qseq = 0;
    // qual
    q = _read_token_aux(p);
    _get_mem(uint8_t, &t, &str, c->l_qseq);
    if (strcmp(q, "*")) {
        _parse_err(p - q - 1 != c->l_qseq, "SEQ and QUAL are of different length");
        for (i = 0; i < c->l_qseq; ++i) t[i] = q[i] - 33;
    } else memset(t, 0xff, c->l_qseq);
    // aux
    // Note that (like the bam1_core_t fields) this aux data in b->data is
    // stored in host endianness; so there is no byte swapping needed here.
    while (p < s->s + s->l) {
        uint8_t type;
        q = _read_token_aux(p); // FIXME: can be accelerated for long 'B' arrays
        _parse_err(p - q - 1 < 6, "incomplete aux field");
        kputsn_(q, 2, &str);
        q += 3; type = *q++; ++q; // q points to value
        if (type == 'A' || type == 'a' || type == 'c' || type == 'C') {
            kputc_('A', &str);
            kputc_(*q, &str);
        } else if (type == 'i' || type == 'I') {
            if (*q == '-') {
                long x = strtol(q, &q, 10);
                if (x >= INT8_MIN) {
                    kputc_('c', &str); kputc_(x, &str);
                } else if (x >= INT16_MIN) {
                    int16_t y = x;
                    kputc_('s', &str); kputsn_((char*)&y, 2, &str);
                } else {
                    int32_t y = x;
                    kputc_('i', &str); kputsn_(&y, 4, &str);
                }
            } else {
                unsigned long x = strtoul(q, &q, 10);
                if (x <= UINT8_MAX) {
                    kputc_('C', &str); kputc_(x, &str);
                } else if (x <= UINT16_MAX) {
                    uint16_t y = x;
                    kputc_('S', &str); kputsn_(&y, 2, &str);
                } else {
                    uint32_t y = x;
                    kputc_('I', &str); kputsn_(&y, 4, &str);
                }
            }
        } else if (type == 'f') {
            float x;
            x = strtod(q, &q);
            kputc_('f', &str); kputsn_(&x, 4, &str);
        } else if (type == 'd') {
            double x;
            x = strtod(q, &q);
            kputc_('d', &str); kputsn_(&x, 8, &str);
        } else if (type == 'Z' || type == 'H') {
            kputc_(type, &str);kputsn_(q, p - q, &str); // note that this include the trailing NULL
        } else if (type == 'B') {
            int32_t n;
            char *r;
            _parse_err(p - q - 1 < 3, "incomplete B-typed aux field");
            type = *q++; // q points to the first ',' following the typing byte
            for (r = q, n = 0; *r; ++r)
                if (*r == ',') ++n;
            kputc_('B', &str); kputc_(type, &str); kputsn_(&n, 4, &str);
            // FIXME: to evaluate which is faster: a) aligned array and then memmove(); b) unaligned array; c) kputsn_()
            if (type == 'c')      while (q + 1 < p) { int8_t   x = strtol(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 'C') while (q + 1 < p) { uint8_t  x = strtoul(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 's') while (q + 1 < p) { int16_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'S') while (q + 1 < p) { uint16_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'i') while (q + 1 < p) { int32_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'I') while (q + 1 < p) { uint32_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'f') while (q + 1 < p) { float    x = strtod(q + 1, &q);    kputsn_(&x, 4, &str); }
            else _parse_err(1, "unrecognized type");
        } else _parse_err(1, "unrecognized type");
    }
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return 0;

#undef _parse_warn
#undef _parse_err
#undef _get_mem
#undef _read_token_aux
#undef _read_token
err_ret:
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return -2;
}